

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymul.hpp
# Opt level: O3

void polymul_internal::polynomial_multiplier<double,_2,_2,_2>::mul_monomial
               (double *dst,double *p1,double *m2)

{
  int iVar1;
  int i;
  long lVar2;
  long lVar3;
  double *pdVar4;
  
  iVar1 = binomial(5,3);
  pdVar4 = dst + iVar1;
  iVar1 = binomial(3,1);
  lVar2 = 0;
  do {
    lVar3 = 0;
    do {
      pdVar4[lVar3] = p1[iVar1 + lVar2] * m2[lVar3] + pdVar4[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 3);
    lVar2 = lVar2 + 1;
    pdVar4 = pdVar4 + 1;
  } while (lVar2 != 3);
  polynomial_multiplier<double,_2,_1,_2>::mul_monomial(dst,p1,m2);
  return;
}

Assistant:

static void mul_monomial(numtype POLYMUL_RESTRICT dst[],
                           const numtype p1[],
                           const numtype m2[]) {
    polynomial_multiplier<numtype, Nvar - 1, Ndeg1, Ndeg2>::mul(
        dst + binomial(Nvar + Ndeg1 + Ndeg2 - 1, Ndeg1 + Ndeg2 - 1),
        p1 + binomial(Nvar + Ndeg1 - 1, Ndeg1 - 1),
        m2);
    polynomial_multiplier<numtype, Nvar, Ndeg1 - 1, Ndeg2>::mul_monomial(
        dst, p1, m2);
  }